

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

ssize_t correct_reed_solomon_decode
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,uint8_t *msg)

{
  polynomial_t locator_log;
  polynomial_t msgpoly;
  field_t field;
  field_t field_00;
  field_t field_01;
  _Bool _Var1;
  field_element_t fVar2;
  uint uVar3;
  ulong uVar4;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  correct_reed_solomon *unaff_retaddr;
  uint i_5;
  uint i_4;
  uint i_3;
  uint order;
  uint i_2;
  _Bool all_zero;
  uint i_1;
  uint i;
  size_t pad_length;
  size_t msg_length;
  correct_reed_solomon *in_stack_00000070;
  field_element_t *roots;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  size_t in_stack_fffffffffffffff8;
  correct_reed_solomon *rs_00;
  
  if (*in_RDI < in_RDX) {
    rs_00 = (correct_reed_solomon *)0xffffffffffffffff;
  }
  else {
    rs_00 = (correct_reed_solomon *)(in_RDX - in_RDI[2]);
    uVar4 = *in_RDI - in_RDX;
    if ((in_RDI[0x26] & 1) == 0) {
      correct_reed_solomon_decoder_create(in_stack_00000070);
    }
    for (uVar8 = 0; uVar8 < in_RDX; uVar8 = uVar8 + 1) {
      *(undefined1 *)(in_RDI[0x10] + (ulong)uVar8) =
           *(undefined1 *)(in_RSI + (in_RDX - (uVar8 + 1)));
    }
    for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
      *(undefined1 *)(in_RDI[0x10] + uVar7 + in_RDX) = 0;
    }
    field_01.log._0_4_ = (int)rs_00;
    field_01.exp = (field_element_t *)uVar4;
    field_01.log._4_4_ = (int)((ulong)rs_00 >> 0x20);
    msgpoly.coeff._4_4_ = in_stack_ffffffffffffffbc;
    msgpoly.coeff._0_4_ = in_stack_ffffffffffffffb8;
    msgpoly.order = uVar7;
    msgpoly._12_4_ = uVar8;
    _Var1 = reed_solomon_find_syndromes
                      (field_01,msgpoly,
                       (field_logarithm_t **)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (field_element_t *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDX);
    uVar6 = CONCAT13(_Var1,(int3)in_stack_ffffffffffffffbc);
    if (_Var1) {
      for (uVar8 = 0; (correct_reed_solomon *)(ulong)uVar8 < rs_00; uVar8 = uVar8 + 1) {
        *(undefined1 *)(in_RCX + (ulong)uVar8) =
             *(undefined1 *)(in_RDI[0x10] + (in_RDX - (uVar8 + 1)));
      }
    }
    else {
      uVar3 = reed_solomon_find_error_locator(unaff_retaddr,in_stack_fffffffffffffff8);
      *(uint *)(in_RDI + 0x13) = uVar3;
      for (uVar5 = 0; uVar5 <= (uint)in_RDI[0x13]; uVar5 = uVar5 + 1) {
        *(undefined1 *)(in_RDI[0x14] + (ulong)uVar5) =
             *(undefined1 *)(in_RDI[5] + (ulong)*(byte *)(in_RDI[0x12] + (ulong)uVar5));
      }
      *(int *)(in_RDI + 0x15) = (int)in_RDI[0x13];
      roots = (field_element_t *)in_RDI[0x1b];
      field.exp._4_4_ = uVar6;
      field.exp._0_4_ = in_stack_ffffffffffffffb8;
      field.log._0_4_ = uVar7;
      field.log._4_4_ = uVar8;
      locator_log.coeff._4_4_ = in_stack_ffffffffffffffac;
      locator_log.coeff._0_4_ = in_stack_ffffffffffffffa8;
      locator_log.order = uVar5;
      locator_log._12_4_ = uVar3;
      _Var1 = reed_solomon_factorize_error_locator
                        (field,in_stack_ffffffffffffffa4,locator_log,roots,
                         (field_logarithm_t **)rs_00);
      if (_Var1) {
        field_00.exp._4_4_ = uVar6;
        field_00.exp._0_4_ = in_stack_ffffffffffffffb8;
        field_00.log._0_4_ = uVar7;
        field_00.log._4_4_ = uVar8;
        reed_solomon_find_error_locations
                  (field_00,(field_logarithm_t)(uVar3 >> 0x18),
                   (field_element_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (field_logarithm_t *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (uint)((ulong)roots >> 0x20),(uint)rs_00);
        reed_solomon_find_error_values(rs_00);
        for (uVar8 = 0; uVar8 < (uint)in_RDI[0x13]; uVar8 = uVar8 + 1) {
          fVar2 = field_sub(*(field_t *)(in_RDI + 4),
                            *(field_element_t *)
                             (in_RDI[0x10] + (ulong)*(byte *)(in_RDI[0x1a] + (ulong)uVar8)),
                            *(field_element_t *)(in_RDI[0x19] + (ulong)uVar8));
          *(field_element_t *)(in_RDI[0x10] + (ulong)*(byte *)(in_RDI[0x1a] + (ulong)uVar8)) = fVar2
          ;
        }
        for (uVar8 = 0; (correct_reed_solomon *)(ulong)uVar8 < rs_00; uVar8 = uVar8 + 1) {
          *(undefined1 *)(in_RCX + (ulong)uVar8) =
               *(undefined1 *)(in_RDI[0x10] + (in_RDX - (uVar8 + 1)));
        }
      }
      else {
        rs_00 = (correct_reed_solomon *)0xffffffffffffffff;
      }
    }
  }
  return (ssize_t)rs_00;
}

Assistant:

ssize_t correct_reed_solomon_decode(correct_reed_solomon *rs, const uint8_t *encoded, size_t encoded_length,
                                    uint8_t *msg) {
    if (encoded_length > rs->block_length) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }


    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    unsigned int order = reed_solomon_find_error_locator(rs, 0);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    if (!reed_solomon_factorize_error_locator(rs->field, 0, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        return -1;
    }

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, 0);

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    return msg_length;
}